

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

void fdb_cmp_func_list_from_filemgr(filemgr *file,list *cmp_func_list)

{
  kvs_header *pkVar1;
  fdb_custom_cmp_variable p_Var2;
  avl_node *paVar3;
  undefined8 *puVar4;
  avl_node *paVar5;
  avl_node *paVar6;
  size_t sVar7;
  char *__dest;
  
  if ((file != (filemgr *)0x0) &&
     (cmp_func_list != (list *)0x0 && file->kv_header != (kvs_header *)0x0)) {
    pthread_spin_lock(&file->kv_header->lock);
    pkVar1 = file->kv_header;
    p_Var2 = pkVar1->default_kvs_cmp;
    if (p_Var2 != (fdb_custom_cmp_variable)0x0) {
      puVar4 = (undefined8 *)calloc(1,0x28);
      puVar4[1] = p_Var2;
      puVar4[2] = pkVar1->default_kvs_cmp_param;
      *puVar4 = 0;
      list_push_back(cmp_func_list,(list_elem *)(puVar4 + 3));
    }
    paVar5 = avl_first(file->kv_header->idx_name);
    while (paVar5 != (avl_node *)0x0) {
      paVar6 = avl_next(paVar5);
      puVar4 = (undefined8 *)calloc(1,0x28);
      paVar3 = paVar5[-5].parent;
      puVar4[1] = paVar5[-6].right;
      puVar4[2] = paVar3;
      paVar5 = paVar5[-7].left;
      sVar7 = strlen((char *)paVar5);
      __dest = (char *)calloc(1,sVar7 + 1);
      *puVar4 = __dest;
      strcpy(__dest,(char *)paVar5);
      list_push_back(cmp_func_list,(list_elem *)(puVar4 + 3));
      paVar5 = paVar6;
    }
    pthread_spin_unlock(&file->kv_header->lock);
    return;
  }
  return;
}

Assistant:

void fdb_cmp_func_list_from_filemgr(struct filemgr *file, struct list *cmp_func_list)
{
    if (!file || !file->kv_header || !cmp_func_list) {
        return;
    }

    struct cmp_func_node *node;

    spin_lock(&file->kv_header->lock);
    // Default KV store cmp function
    if (file->kv_header->default_kvs_cmp) {
        node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        node->func = file->kv_header->default_kvs_cmp;
        node->user_param = file->kv_header->default_kvs_cmp_param;
        node->kvs_name = NULL;
        list_push_back(cmp_func_list, &node->le);
    }

    // Rest of KV stores
    struct kvs_node *kvs_node;
    struct avl_node *a = avl_first(file->kv_header->idx_name);
    while (a) {
        kvs_node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(a);
        node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        node->func = kvs_node->custom_cmp;
        node->user_param = kvs_node->user_param;
        node->kvs_name = (char*)calloc(1, strlen(kvs_node->kvs_name)+1);
        strcpy(node->kvs_name, kvs_node->kvs_name);
        list_push_back(cmp_func_list, &node->le);
    }
    spin_unlock(&file->kv_header->lock);
}